

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall
QApplicationPrivate::notifyActiveWindowChange(QApplicationPrivate *this,QWindow *previous)

{
  Data *pDVar1;
  QWindow *object;
  bool bVar2;
  QWidget *pQVar3;
  QWindow *pQVar4;
  QWidgetWindow *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = inPopupMode();
  object = QGuiApplicationPrivate::focus_window;
  if (!bVar2) {
    pQVar3 = qt_tlw_for_window(QGuiApplicationPrivate::focus_window);
    setActiveWindow(pQVar3);
    if (pQVar3 != (QWidget *)0x0 && object != (QWindow *)0x0) {
      pQVar4 = QWidget::windowHandle(pQVar3);
      if (object != pQVar4) {
        pQVar5 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>((QObject *)object);
        if ((((pQVar5 != (QWidgetWindow *)0x0) &&
             (pDVar1 = (pQVar5->m_widget).wp.d, pDVar1 != (Data *)0x0)) &&
            (*(int *)(pDVar1 + 4) != 0)) &&
           (pQVar3 = (QWidget *)(pQVar5->m_widget).wp.value, pQVar3 != (QWidget *)0x0)) {
          lVar6 = (**(code **)(*(long *)pQVar3 + 8))(pQVar3,"QAxHostWidget");
          if (lVar6 != 0) {
            QWidget::setFocus(pQVar3,ActiveWindowFocusReason);
          }
        }
      }
    }
    if (previous != (QWindow *)0x0) {
      pQVar5 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>((QObject *)previous);
      if (pQVar5 == (QWidgetWindow *)0x0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_38,WindowDeactivate);
        QCoreApplication::sendEvent((QObject *)previous,(QEvent *)&local_38);
        QEvent::~QEvent((QEvent *)&local_38);
      }
    }
    if (object != (QWindow *)0x0) {
      pQVar5 = QtPrivate::qobject_cast_helper<QWidgetWindow*,QObject>((QObject *)object);
      if (pQVar5 == (QWidgetWindow *)0x0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_38,WindowActivate);
        QCoreApplication::sendEvent((QObject *)object,(QEvent *)&local_38);
        QEvent::~QEvent((QEvent *)&local_38);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::notifyActiveWindowChange(QWindow *previous)
{
#ifndef Q_OS_MACOS
    // Some delayed focus event to ignore, unless we are on cocoa where
    // popups can be opened via right-click on inactive applications
    if (inPopupMode())
        return;
#endif
    QWindow *focusWindow = QGuiApplicationPrivate::focus_window;
    QWidget *focusWidget = qt_tlw_for_window(focusWindow);
    QApplicationPrivate::setActiveWindow(focusWidget);
    // QTBUG-37126, Active X controls may set the focus on native child widgets.
    if (focusWindow && focusWidget && focusWindow != focusWidget->windowHandle()) {
        if (QWidgetWindow *widgetWindow = qobject_cast<QWidgetWindow *>(focusWindow))
            if (QWidget *widget = widgetWindow->widget())
                if (widget->inherits("QAxHostWidget"))
                    widget->setFocus(Qt::ActiveWindowFocusReason);
    }

    // QApplication::setActiveWindow() will deliver window activation events for
    // QWidgetWindows. But for other subclasses of QWindow (like QQuickWindow), we
    // need to send them explicitly, like we do from the base class implementation.
    if (previous && !qobject_cast<QWidgetWindow *>(previous)) {
        QEvent de(QEvent::WindowDeactivate);
        QCoreApplication::sendEvent(previous, &de);
    }

    if (focusWindow && !qobject_cast<QWidgetWindow *>(focusWindow)) {
        QEvent ae(QEvent::WindowActivate);
        QCoreApplication::sendEvent(focusWindow, &ae);
    }

    // don't call base class to avoid double delivery of WindowActivate/Deactivate events
}